

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bits.c
# Opt level: O1

void bits_bitmap2items(char *bitmap,lysc_type_bits *type,lysc_type_bitenum_item **items)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  int iVar4;
  int iVar5;
  byte bVar6;
  lysc_type_bitenum_item *plVar7;
  lysc_type_bitenum_item *plVar8;
  long lVar9;
  uint64_t u;
  ulong uVar10;
  ulong uVar11;
  
  sVar2 = lyplg_type_bits_bitmap_size(type);
  if (sVar2 != 0) {
    sVar3 = 0;
    iVar4 = 0;
    do {
      iVar5 = iVar4 + 8;
      bVar6 = 1;
      do {
        if ((bitmap[sVar3] & bVar6) != 0) {
          plVar8 = type->bits;
          uVar10 = 0;
          plVar7 = plVar8;
          while( true ) {
            if (plVar8 == (lysc_type_bitenum_item *)0x0) {
              uVar11 = 0;
            }
            else {
              uVar11._0_4_ = plVar8[-1].field_4;
              uVar11._4_2_ = plVar8[-1].flags;
              uVar11._6_2_ = *(undefined2 *)&plVar8[-1].field_0x26;
            }
            if ((uVar11 <= uVar10) || ((plVar7->field_4).value == iVar4)) break;
            uVar10 = uVar10 + 1;
            plVar7 = plVar7 + 1;
          }
          if (items == (lysc_type_bitenum_item **)0x0) {
            plVar8 = (lysc_type_bitenum_item *)0x0;
          }
          else {
            plVar8 = items[-1];
          }
          items[(long)plVar8] = plVar7;
          items[-1] = (lysc_type_bitenum_item *)((long)&items[-1]->name + 1);
        }
        plVar8 = type->bits;
        if (plVar8 == (lysc_type_bitenum_item *)0x0) {
          lVar9 = -1;
        }
        else {
          lVar9 = *(long *)&plVar8[-1].field_4 + -1;
        }
        iVar1 = iVar4;
        if (iVar4 == plVar8[lVar9].field_4.value) break;
        iVar4 = iVar4 + 1;
        bVar6 = bVar6 * '\x02';
        iVar1 = iVar5;
      } while (iVar4 != iVar5);
      iVar4 = iVar1;
      sVar3 = sVar3 + 1;
    } while (sVar3 != sVar2);
  }
  return;
}

Assistant:

static void
bits_bitmap2items(const char *bitmap, struct lysc_type_bits *type, struct lysc_type_bitenum_item **items)
{
    size_t i, bitmap_size = lyplg_type_bits_bitmap_size(type);
    uint32_t bit_pos;
    uint8_t bitmask;
    const uint8_t *byte;

    bit_pos = 0;
    for (i = 0; i < bitmap_size; ++i) {
        /* check this byte (but not necessarily all bits in the last byte) */
        byte = (uint8_t *)BITS_BITMAP_BYTE(bitmap, bitmap_size, i);
        for (bitmask = 1; bitmask; bitmask <<= 1) {
            if (*byte & bitmask) {
                /* add this bit */
                bits_add_item(bit_pos, type, items);
            }

            if (bit_pos == BITS_LAST_BIT_POSITION(type)) {
                /* we have checked the last valid bit */
                break;
            }

            ++bit_pos;
        }
    }
}